

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdUtils.h
# Opt level: O2

int16 __thiscall
Js::SIMDUtils::SIMD128InnerExtractLaneI8(SIMDUtils *this,SIMDValue src1,uint32 lane)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SIMDUtils *local_28;
  SIMDValue src1_local;
  
  local_28 = this;
  src1_local.field_0.i64[0] = src1.field_0._0_8_;
  if (7 < src1.field_0._8_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/SimdUtils.h"
                                ,0xed,"(lane < 8)","lane < 8");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return *(int16 *)((long)&local_28 + (ulong)src1.field_0._8_4_ * 2);
}

Assistant:

static inline SIMDValue SIMD128BitSelect(const SIMDValue src1, const SIMDValue src2, const SIMDValue mask)
        {
            SIMDValue res{ 0 };
            res.i32[0] = (src1.i32[0] & mask.i32[0]) | (src2.i32[0] & ~mask.i32[0]);
            res.i32[1] = (src1.i32[1] & mask.i32[1]) | (src2.i32[1] & ~mask.i32[1]);
            res.i32[2] = (src1.i32[2] & mask.i32[2]) | (src2.i32[2] & ~mask.i32[2]);
            res.i32[3] = (src1.i32[3] & mask.i32[3]) | (src2.i32[3] & ~mask.i32[3]);
            return res;
        }